

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

Curl_dns_entry * Curl_cache_addr(Curl_easy *data,Curl_addrinfo *addr,char *hostname,int port)

{
  Curl_addrinfo **ppCVar1;
  undefined8 uVar2;
  CURLcode CVar3;
  Curl_addrinfo *pCVar4;
  undefined8 *puVar5;
  ulong uVar6;
  uchar *rnd;
  size_t sVar7;
  Curl_dns_entry *pCVar8;
  undefined4 in_register_0000000c;
  ulong buflen;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  char entry_id [262];
  char local_138 [264];
  
  buflen = CONCAT44(in_register_0000000c,port);
  if (((data->set).field_0x8e7 & 0x10) != 0) {
    uVar11 = 0;
    pCVar4 = addr;
    if (addr != (Curl_addrinfo *)0x0) {
      do {
        ppCVar1 = &pCVar4->ai_next;
        uVar11 = uVar11 + 1;
        pCVar4 = *ppCVar1;
      } while (*ppCVar1 != (Curl_addrinfo *)0x0);
    }
    bVar12 = true;
    if (1 < (int)uVar11) {
      Curl_infof(data,"Shuffling %i addresses",(ulong)uVar11);
      uVar10 = (ulong)uVar11;
      puVar5 = (undefined8 *)(*Curl_cmalloc)(uVar10 * 8);
      if (puVar5 == (undefined8 *)0x0) {
        bVar12 = false;
      }
      else {
        *puVar5 = addr;
        uVar6 = 1;
        do {
          buflen = *(ulong *)(puVar5[uVar6 - 1] + 0x28);
          puVar5[uVar6] = buflen;
          uVar6 = uVar6 + 1;
        } while (uVar10 != uVar6);
        rnd = (uchar *)(*Curl_cmalloc)(uVar10 << 2);
        bVar12 = rnd != (uchar *)0x0;
        if (bVar12) {
          CVar3 = Curl_rand(data,rnd,uVar10 << 2);
          if (CVar3 == CURLE_OK) {
            buflen = (ulong)(uVar11 - 1);
            uVar10 = buflen;
            uVar9 = uVar11;
            do {
              uVar2 = puVar5[(ulong)*(uint *)(rnd + uVar10 * 4) % (ulong)uVar9];
              puVar5[(ulong)*(uint *)(rnd + uVar10 * 4) % (ulong)uVar9] = puVar5[uVar10];
              puVar5[uVar10] = uVar2;
              uVar10 = uVar10 - 1;
              uVar9 = uVar9 - 1;
            } while (1 < (int)uVar9);
            uVar10 = 2;
            if (2 < (int)uVar11) {
              uVar10 = (ulong)uVar11;
            }
            uVar6 = 1;
            do {
              *(undefined8 *)(puVar5[uVar6 - 1] + 0x28) = puVar5[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar10 != uVar6);
            *(undefined8 *)(puVar5[buflen] + 0x28) = 0;
            addr = (Curl_addrinfo *)*puVar5;
          }
          (*Curl_cfree)(rnd);
        }
        (*Curl_cfree)(puVar5);
      }
    }
    if (!bVar12) {
      return (Curl_dns_entry *)0x0;
    }
  }
  puVar5 = (undefined8 *)(*Curl_ccalloc)(1,0x18);
  if (puVar5 != (undefined8 *)0x0) {
    create_hostcache_id(hostname,port,local_138,buflen);
    sVar7 = strlen(local_138);
    puVar5[2] = 1;
    *puVar5 = addr;
    time(puVar5 + 1);
    if (puVar5[1] == 0) {
      puVar5[1] = 1;
    }
    pCVar8 = (Curl_dns_entry *)Curl_hash_add((data->dns).hostcache,local_138,sVar7 + 1,puVar5);
    if (pCVar8 != (Curl_dns_entry *)0x0) {
      pCVar8->inuse = pCVar8->inuse + 1;
      return pCVar8;
    }
    (*Curl_cfree)(puVar5);
  }
  return (Curl_dns_entry *)0x0;
}

Assistant:

struct Curl_dns_entry *
Curl_cache_addr(struct Curl_easy *data,
                struct Curl_addrinfo *addr,
                const char *hostname,
                int port)
{
  char entry_id[MAX_HOSTCACHE_LEN];
  size_t entry_len;
  struct Curl_dns_entry *dns;
  struct Curl_dns_entry *dns2;

#ifndef CURL_DISABLE_SHUFFLE_DNS
  /* shuffle addresses if requested */
  if(data->set.dns_shuffle_addresses) {
    CURLcode result = Curl_shuffle_addr(data, &addr);
    if(result)
      return NULL;
  }
#endif

  /* Create a new cache entry */
  dns = calloc(1, sizeof(struct Curl_dns_entry));
  if(!dns) {
    return NULL;
  }

  /* Create an entry id, based upon the hostname and port */
  create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
  entry_len = strlen(entry_id);

  dns->inuse = 1;   /* the cache has the first reference */
  dns->addr = addr; /* this is the address(es) */
  time(&dns->timestamp);
  if(dns->timestamp == 0)
    dns->timestamp = 1;   /* zero indicates permanent CURLOPT_RESOLVE entry */

  /* Store the resolved data in our DNS cache. */
  dns2 = Curl_hash_add(data->dns.hostcache, entry_id, entry_len + 1,
                       (void *)dns);
  if(!dns2) {
    free(dns);
    return NULL;
  }

  dns = dns2;
  dns->inuse++;         /* mark entry as in-use */
  return dns;
}